

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseHexLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                *this)

{
  byte bVar1;
  UnicodeChar UVar2;
  byte *pbVar3;
  char *pcVar4;
  byte unaff_R13B;
  UTF8Reader UVar5;
  bool bVar6;
  bool bVar7;
  UTF8Reader t;
  UTF8Reader local_40;
  UTF8Reader local_38;
  
  UVar5.data = (this->input).data;
  pbVar3 = (byte *)0x2b0288;
  local_40.data = UVar5.data;
  do {
    bVar1 = *pbVar3;
    if (bVar1 == 0) {
      unaff_R13B = 1;
      bVar6 = false;
      UVar5.data = local_40.data;
    }
    else {
      UVar2 = UTF8Reader::getAndAdvance(&local_40);
      bVar6 = UVar2 == bVar1;
      unaff_R13B = unaff_R13B & bVar6;
    }
    pbVar3 = pbVar3 + 1;
  } while (bVar6);
  bVar6 = true;
  if (unaff_R13B == 0) {
    pcVar4 = "0X";
    local_40.data = UVar5.data;
    do {
      bVar1 = *pcVar4;
      if (bVar1 == 0) {
        bVar6 = true;
        bVar7 = false;
        UVar5.data = local_40.data;
      }
      else {
        UVar2 = UTF8Reader::getAndAdvance(&local_40);
        bVar7 = UVar2 == bVar1;
        bVar6 = (bool)(bVar6 & bVar7);
      }
      pcVar4 = (char *)((byte *)pcVar4 + 1);
    } while (bVar7);
  }
  if (bVar6) {
    local_38.data = UVar5.data;
    bVar6 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::
            parseIntegerWithBase<16,soul::Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::parseHexLiteral()::_lambda(unsigned_int)_1_>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,&local_38,(anon_class_1_0_00000001 *)&local_40);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool parseHexLiteral()
    {
        auto t = input;

        if (t.advanceIfStartsWith ("0x", "0X"))
            return parseIntegerWithBase<16> (t, [] (UnicodeChar c) -> int { return choc::text::hexDigitToInt (c); });

        return false;
    }